

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::StaticAssertion::~StaticAssertion(StaticAssertion *this)

{
  ~StaticAssertion(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

StaticAssertion (const Context& c, Expression& failureCondition, std::string error)
            : Expression (ObjectType::StaticAssertion, c, ExpressionKind::unknown),
              condition (failureCondition), errorMessage (std::move (error))
        {
            if (errorMessage.empty())
                errorMessage = "static_assert failed";

            SOUL_ASSERT (isPossiblyValue (condition.get()));
        }